

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

void __thiscall
el::base::TypedConfigurations::setValue<bool>
          (TypedConfigurations *this,Level level,bool *value,
          map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
          *confMap,bool includeGlobalLevel)

{
  _Rb_tree_header *p_Var1;
  mapped_type_conflict mVar2;
  _Base_ptr p_Var3;
  mapped_type_conflict *pmVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  Level local_14;
  pair<el::Level,_bool> local_10;
  
  local_14 = level;
  if ((confMap->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0 && includeGlobalLevel) {
    local_10.second = *value;
    local_10.first = Global;
  }
  else {
    p_Var1 = &(confMap->_M_t)._M_impl.super__Rb_tree_header;
    p_Var3 = (confMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = p_Var3;
    p_Var6 = &p_Var1->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[bVar7]) {
      bVar7 = p_Var5[1]._M_color == _S_red;
      if (!bVar7) {
        p_Var6 = p_Var5;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var5 = p_Var6, _S_black < p_Var6[1]._M_color)) {
      p_Var5 = &p_Var1->_M_header;
    }
    p_Var6 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && ((bool)p_Var5[1].field_0x4 == *value)) {
      return;
    }
    for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[bVar7]) {
      bVar7 = p_Var3[1]._M_color < level;
      if (!bVar7) {
        p_Var6 = p_Var3;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var5 = p_Var6, level < p_Var6[1]._M_color)) {
      p_Var5 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      mVar2 = *value;
      pmVar4 = utils::std::
               map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
               ::at(confMap,&local_14);
      *pmVar4 = mVar2;
      return;
    }
    local_10.second = *value;
    local_10.first = level;
  }
  std::
  _Rb_tree<el::Level,std::pair<el::Level_const,bool>,std::_Select1st<std::pair<el::Level_const,bool>>,std::less<el::Level>,std::allocator<std::pair<el::Level_const,bool>>>
  ::_M_emplace_unique<std::pair<el::Level,bool>>
            ((_Rb_tree<el::Level,std::pair<el::Level_const,bool>,std::_Select1st<std::pair<el::Level_const,bool>>,std::less<el::Level>,std::allocator<std::pair<el::Level_const,bool>>>
              *)confMap,&local_10);
  return;
}

Assistant:

void setValue(Level level, const Conf_T& value, std::map<Level, Conf_T>* confMap, bool includeGlobalLevel = true) {
    // If map is empty and we are allowed to add into generic level (Level::Global), do it!
    if (confMap->empty() && includeGlobalLevel) {
      confMap->insert(std::make_pair(Level::Global, value));
      return;
    }
    // If same value exist in generic level already, dont add it to explicit level
    typename std::map<Level, Conf_T>::iterator it = confMap->find(Level::Global);
    if (it != confMap->end() && it->second == value) {
      return;
    }
    // Now make sure we dont double up values if we really need to add it to explicit level
    it = confMap->find(level);
    if (it == confMap->end()) {
      // Value not found for level, add new
      confMap->insert(std::make_pair(level, value));
    } else {
      // Value found, just update value
      confMap->at(level) = value;
    }
  }